

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserParserTemplateBase.h
# Opt level: O0

UNION__gles_enumeration __thiscall
GeneratedSaxParser::ParserTemplateBase::toDataPrefix<COLLADASaxFWL14::UNION__gles_enumeration>
          (ParserTemplateBase *this,ParserChar *prefixedBuffer,ParserChar *prefixedBufferEnd,
          ParserChar **buffer,ParserChar *bufferEnd,bool *failed,
          _func_UNION__gles_enumeration_ParserChar_ptr_ptr_ParserChar_ptr_bool_ptr *toData)

{
  long lVar1;
  bool bVar2;
  size_t __n;
  StackMemoryManager *this_00;
  void *pvVar3;
  long *in_RCX;
  ParserChar *in_RDX;
  ParserChar *in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  code *in_stack_00000008;
  ParserChar *newBufferPostParse;
  ParserChar *newBuffer;
  size_t newBufferSize;
  size_t bufferSize;
  size_t prefixBufferSize;
  ParserChar *bufferPos;
  ParserChar *prefixBufferStartPos;
  ParserChar *prefixBufferPos;
  UNION__gles_enumeration value;
  void *local_78;
  size_t in_stack_ffffffffffffff90;
  ParserChar *local_50;
  ParserChar *local_48;
  ParserChar *local_40;
  UNION__gles_enumeration local_8;
  
  local_48 = (ParserChar *)0x0;
  for (local_40 = in_RSI; local_40 != in_RDX; local_40 = local_40 + 1) {
    bVar2 = Utils::isWhiteSpace(*local_40);
    if ((!bVar2) && (local_48 == (ParserChar *)0x0)) {
      local_48 = local_40;
    }
  }
  if (local_48 == (ParserChar *)0x0) {
    local_8 = (UNION__gles_enumeration)(*in_stack_00000008)(in_RCX,in_R8,in_R9);
  }
  else {
    local_50 = (ParserChar *)*in_RCX;
    while( true ) {
      bVar2 = Utils::isWhiteSpace(*local_50);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      local_50 = local_50 + 1;
    }
    __n = (long)local_40 - (long)local_48;
    lVar1 = *in_RCX;
    this_00 = (StackMemoryManager *)(__n + ((long)local_50 - lVar1));
    pvVar3 = StackMemoryManager::newObject(this_00,in_stack_ffffffffffffff90);
    memcpy(pvVar3,local_48,__n);
    local_78 = pvVar3;
    memcpy((void *)((long)pvVar3 + __n),(void *)*in_RCX,(long)local_50 - lVar1);
    *(undefined1 *)((long)local_78 + (long)this_00) = 0x20;
    pvVar3 = local_78;
    local_8 = (UNION__gles_enumeration)
              (*in_stack_00000008)(&local_78,(long)local_78 + (long)this_00 + 1,in_R9);
    *in_RCX = (long)local_78 + *in_RCX + (-__n - (long)pvVar3);
  }
  return local_8;
}

Assistant:

DataType ParserTemplateBase::toDataPrefix(
        const ParserChar* prefixedBuffer,
        const ParserChar* prefixedBufferEnd,
        const ParserChar** buffer,
        const ParserChar* bufferEnd,
        bool& failed,
        DataType (*toData)( const ParserChar**, const ParserChar*, bool& )
        )
    {
        const ParserChar* prefixBufferPos = prefixedBuffer;
        const ParserChar* prefixBufferStartPos = 0;
        while ( prefixBufferPos != prefixedBufferEnd )
        {
            if (!Utils::isWhiteSpace(*prefixBufferPos ) && !prefixBufferStartPos)
                prefixBufferStartPos = prefixBufferPos;
            ++prefixBufferPos;
        }

        //if prefixedBuffer contains only white spaces, we can ignore it.
        if ( !prefixBufferStartPos )
            return toData(buffer, bufferEnd, failed);

        //find first whitespace in buffer
        const ParserChar* bufferPos = *buffer;
        while ( !Utils::isWhiteSpace(*bufferPos) )
            ++bufferPos;

        size_t prefixBufferSize = prefixBufferPos - prefixBufferStartPos;
        size_t bufferSize = bufferPos - *buffer;
        size_t newBufferSize = prefixBufferSize + bufferSize;
        ParserChar* newBuffer =  (ParserChar*)mStackMemoryManager.newObject((newBufferSize + 1)*sizeof(ParserChar));
        memcpy(newBuffer, prefixBufferStartPos, prefixBufferSize*sizeof(ParserChar));
        memcpy(newBuffer + prefixBufferSize, *buffer, bufferSize*sizeof(ParserChar));
        newBuffer[newBufferSize] = ' ';
        ParserChar* newBufferPostParse = newBuffer;
        DataType value = toData( (const ParserChar**)&newBufferPostParse, newBuffer + newBufferSize + 1, failed);
        *buffer += (newBufferPostParse - newBuffer - prefixBufferSize);

        // see comment in overloaded method
        //mStackMemoryManager.deleteObject();

        return value;
    }